

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::DefaultMinimize::handleUnsat(DefaultMinimize *this,Solver *s,bool up,LitVec *out)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  
  bVar3 = SharedMinimizeData::optimize((this->super_MinimizeConstraint).shared_);
  bVar4 = false;
  if (bVar3) {
    bVar4 = commitLowerBound(this,s,up);
  }
  uVar1 = (this->super_MinimizeConstraint).tag_.rep_;
  uVar2 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc));
  uVar5 = uVar2 >> 4;
  if ((byte)((byte)uVar2 & 3) != (byte)(2U - ((uVar1 & 2) == 0))) {
    uVar5 = 0;
  }
  relaxBound(this,false);
  if (((bVar4 != false) && (uVar5 != 0)) && (uVar1 = (s->levels_).root, uVar5 <= uVar1)) {
    Solver::popRootLevel(s,uVar1 - uVar5,out,true);
    bVar3 = Solver::popRootLevel(s,1,(LitVec *)0x0,true);
    return bVar3;
  }
  return false;
}

Assistant:

bool DefaultMinimize::handleUnsat(Solver& s, bool up, LitVec& out) {
	bool more = shared_->optimize() && commitLowerBound(s, up);
	uint32 dl = s.isTrue(tag_) ? s.level(tag_.var()) : 0;
	relaxBound(false);
	if (more && dl && dl <= s.rootLevel()) {
		s.popRootLevel(s.rootLevel()-dl, &out); // pop and remember new path
		return s.popRootLevel(1);               // pop tag - disable constraint
	}
	return false;
}